

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

uint RigidBodyDynamics::GetMovableBodyId(Model *model,uint id)

{
  bool bVar1;
  
  bVar1 = Model::IsFixedBodyId(model,id);
  if (bVar1) {
    id = (model->mFixedBodies).
         super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
         .
         super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
         ._M_impl.super__Vector_impl_data._M_start[id - model->fixed_body_discriminator].
         mMovableParent;
  }
  return id;
}

Assistant:

unsigned int GetMovableBodyId (Model& model, unsigned int id)
{
  if(model.IsFixedBodyId(id)) {
    unsigned int fbody_id = id - model.fixed_body_discriminator;
    return model.mFixedBodies[fbody_id].mMovableParent;
  } else {
    return id;
  }
}